

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<unsigned_short,unsigned_short,unsigned_short,duckdb::BinaryZeroIsNullWrapper,duckdb::DivideOperator,bool,false,false>
               (unsigned_short *ldata,unsigned_short *rdata,unsigned_short *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  byte bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ushort uVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  idx_t idx_in_entry;
  ulong uVar9;
  unsigned_short *puVar10;
  unsigned_short *puVar11;
  unsigned_short *puVar12;
  unsigned_long uVar13;
  ulong uVar14;
  ulong uVar15;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  idx_t local_88;
  unsigned_short *local_80;
  unsigned_short *local_78;
  idx_t local_70;
  unsigned_short *local_68;
  ulong local_60;
  buffer_ptr<ValidityBuffer> *local_58;
  unsigned_short *local_50;
  unsigned_short *local_48;
  unsigned_short *local_40;
  ulong local_38;
  
  local_80 = ldata;
  local_78 = rdata;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar9 = 0;
      do {
        uVar7 = ldata[uVar9];
        if (rdata[uVar9] == 0) {
          if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            local_88 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,&local_88);
            p_Var6 = p_Stack_90;
            peVar5 = local_98;
            local_98 = (element_type *)0x0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar5;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var6;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
            }
            if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 (unsigned_long *)
                 (pTVar8->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            rdata = local_78;
            ldata = local_80;
          }
          bVar4 = (byte)uVar9 & 0x3f;
          puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask + (uVar9 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
        }
        else {
          uVar7 = uVar7 / rdata[uVar9];
        }
        result_data[uVar9] = uVar7;
        uVar9 = uVar9 + 1;
      } while (count != uVar9);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_60 = count + 0x3f >> 6;
    local_58 = &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    local_38 = 0;
    uVar9 = 0;
    local_70 = count;
    local_68 = result_data;
    do {
      puVar10 = local_68;
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar13 = 0xffffffffffffffff;
      }
      else {
        uVar13 = puVar2[local_38];
      }
      uVar14 = uVar9 + 0x40;
      if (count <= uVar9 + 0x40) {
        uVar14 = count;
      }
      uVar15 = uVar14;
      if (uVar13 != 0) {
        uVar15 = uVar9;
        if (uVar13 == 0xffffffffffffffff) {
          if (uVar9 < uVar14) {
            do {
              uVar7 = ldata[uVar9];
              if (rdata[uVar9] == 0) {
                if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                    (unsigned_long *)0x0) {
                  local_88 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_98,&local_88);
                  p_Var6 = p_Stack_90;
                  peVar5 = local_98;
                  local_98 = (element_type *)0x0;
                  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal
                           .
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar5;
                  (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var6;
                  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                  }
                  if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                  }
                  pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                           operator->(local_58);
                  (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                       (unsigned_long *)
                       (pTVar8->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                  rdata = local_78;
                  ldata = local_80;
                }
                bVar4 = (byte)uVar9 & 0x3f;
                puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                         (uVar9 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
              }
              else {
                uVar7 = uVar7 / rdata[uVar9];
              }
              puVar10[uVar9] = uVar7;
              uVar9 = uVar9 + 1;
              uVar15 = uVar9;
            } while (uVar14 != uVar9);
          }
        }
        else {
          count = local_70;
          if (uVar9 < uVar14) {
            puVar10 = local_68 + uVar9;
            puVar11 = rdata + uVar9;
            puVar12 = ldata + uVar9;
            uVar15 = 0;
            local_50 = puVar12;
            local_48 = puVar11;
            local_40 = puVar10;
            do {
              if ((uVar13 >> (uVar15 & 0x3f) & 1) != 0) {
                uVar7 = puVar12[uVar15];
                if (puVar11[uVar15] == 0) {
                  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                      (unsigned_long *)0x0) {
                    local_88 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_98,&local_88);
                    p_Var6 = p_Stack_90;
                    peVar5 = local_98;
                    local_98 = (element_type *)0x0;
                    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar5;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var6;
                    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                    }
                    if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                    }
                    pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                             operator->(local_58);
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         (unsigned_long *)
                         (pTVar8->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>;
                    rdata = local_78;
                    ldata = local_80;
                    puVar10 = local_40;
                    puVar11 = local_48;
                    puVar12 = local_50;
                  }
                  bVar4 = (byte)(uVar9 + uVar15) & 0x3f;
                  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                           (uVar9 + uVar15 >> 6);
                  *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
                }
                else {
                  uVar7 = uVar7 / puVar11[uVar15];
                }
                puVar10[uVar15] = uVar7;
              }
              uVar15 = uVar15 + 1;
            } while ((uVar9 - uVar14) + uVar15 != 0);
            uVar15 = uVar9 + uVar15;
            count = local_70;
          }
        }
      }
      local_38 = local_38 + 1;
      uVar9 = uVar15;
    } while (local_38 != local_60);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}